

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O2

bool __thiscall
dxil_spv::Converter::Impl::type_can_relax_precision(Impl *this,Type *type,bool known_integer_sign)

{
  TypeID TVar1;
  uint uVar2;
  ArrayType *this_00;
  VectorType *this_01;
  
  if ((this->options).arithmetic_relaxed_precision != true) {
    return false;
  }
  TVar1 = LLVMBC::Type::getTypeID(type);
  if (TVar1 == ArrayTyID) {
    this_00 = LLVMBC::cast<LLVMBC::ArrayType>(type);
    type = LLVMBC::Type::getArrayElementType(&this_00->super_Type);
  }
  TVar1 = LLVMBC::Type::getTypeID(type);
  if (TVar1 == VectorTyID) {
    this_01 = LLVMBC::cast<LLVMBC::VectorType>(type);
    type = LLVMBC::VectorType::getElementType(this_01);
  }
  if (((this->execution_mode_meta).native_16bit_operations == false) &&
     ((this->options).min_precision_prefer_native_16bit == false)) {
    TVar1 = LLVMBC::Type::getTypeID(type);
    if (TVar1 == HalfTyID) {
      return true;
    }
    TVar1 = LLVMBC::Type::getTypeID(type);
    if (TVar1 == IntegerTyID) {
      uVar2 = LLVMBC::Type::getIntegerBitWidth(type);
      return uVar2 == 0x10 && known_integer_sign;
    }
  }
  return false;
}

Assistant:

bool Converter::Impl::type_can_relax_precision(const llvm::Type *type, bool known_integer_sign) const
{
	if (!options.arithmetic_relaxed_precision)
		return false;

	if (type->getTypeID() == llvm::Type::TypeID::ArrayTyID)
		type = llvm::cast<llvm::ArrayType>(type)->getArrayElementType();
	if (type->getTypeID() == llvm::Type::TypeID::VectorTyID)
		type = llvm::cast<llvm::VectorType>(type)->getElementType();

	return (!execution_mode_meta.native_16bit_operations && !options.min_precision_prefer_native_16bit) &&
	       (type->getTypeID() == llvm::Type::TypeID::HalfTyID ||
	        (type->getTypeID() == llvm::Type::TypeID::IntegerTyID && type->getIntegerBitWidth() == 16 &&
	         known_integer_sign));
}